

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

lua_Integer lua_tointegerx(lua_State *L,int idx,int *ok)

{
  double dVar1;
  int iVar2;
  TValue *pTVar3;
  lua_Integer lVar4;
  TValue tmp;
  TValue local_18;
  
  pTVar3 = index2adr(L,idx);
  if ((pTVar3->field_2).it < 0xfffeffff) {
LAB_0010eb83:
    dVar1 = pTVar3->n;
    if (ok != (int *)0x0) {
      *ok = 1;
    }
    lVar4 = (lua_Integer)dVar1;
  }
  else {
    if ((pTVar3->field_2).it == 0xfffffffb) {
      iVar2 = lj_strscan_num((GCstr *)(ulong)(pTVar3->u32).lo,&local_18);
      pTVar3 = &local_18;
      if (iVar2 != 0) goto LAB_0010eb83;
    }
    if (ok != (int *)0x0) {
      *ok = 0;
    }
    lVar4 = 0;
  }
  return lVar4;
}

Assistant:

LUA_API lua_Integer lua_tointegerx(lua_State *L, int idx, int *ok)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    if (ok) *ok = 1;
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp))) {
      if (ok) *ok = 0;
      return 0;
    }
    if (tvisint(&tmp)) {
      if (ok) *ok = 1;
      return intV(&tmp);
    }
    n = numV(&tmp);
  }
  if (ok) *ok = 1;
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}